

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O1

void fast_float::parse_mantissa<char>
               (bigint *result,parsed_number_string_t<char> *num,size_t max_digits,size_t *digits)

{
  limb *plVar1;
  size_t sVar2;
  ushort uVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  *digits = 0;
  plVar9 = (long *)(num->integer).ptr;
  sVar2 = (num->integer).length;
  plVar6 = (long *)((long)plVar9 + sVar2);
  sVar11 = sVar2;
  for (plVar8 = plVar9; (7 < (long)sVar11 && (*plVar8 == 0x3030303030303030)); plVar8 = plVar8 + 1)
  {
    sVar11 = sVar11 - 8;
  }
  for (; (plVar8 != plVar6 && ((char)*plVar8 == '0')); plVar8 = (long *)((long)plVar8 + 1)) {
  }
  if (plVar8 != plVar6) {
    do {
      if ((long)plVar6 - (long)plVar8 < 8) {
        uVar4 = 0;
        uVar13 = 0;
      }
      else {
        sVar11 = *digits;
        pcVar7 = (char *)((long)plVar9 + ((sVar2 - 8) - (long)plVar8));
        uVar10 = max_digits - sVar11;
        uVar13 = 0;
        uVar4 = 0;
        do {
          if (uVar10 < 8) {
            plVar8 = (long *)((long)plVar8 + uVar4);
            goto LAB_003dc079;
          }
          uVar12 = *(long *)((long)plVar8 + uVar4) + 0xcfcfcfcfcfcfcfd0;
          uVar12 = (uVar12 >> 8) + uVar12 * 10;
          uVar13 = ((uVar12 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar12 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar13 * 100000000;
          uVar12 = uVar4 + 8;
          *digits = sVar11 + 8 + uVar4;
          if ((long)pcVar7 < 8) break;
          pcVar7 = pcVar7 + -8;
          uVar10 = uVar10 - 8;
          bVar14 = uVar4 == 0;
          uVar4 = uVar12;
        } while (bVar14);
        plVar8 = (long *)((long)plVar8 + uVar12);
        uVar4 = uVar12;
      }
LAB_003dc079:
      uVar10 = *digits;
      uVar12 = uVar4;
      if ((plVar8 != plVar6 && uVar4 < 0x13) && uVar10 < max_digits) {
        do {
          uVar13 = ((long)(char)*plVar8 + uVar13 * 10) - 0x30;
          plVar8 = (long *)((long)plVar8 + 1);
          uVar4 = uVar12 + 1;
          uVar10 = uVar10 + 1;
          *digits = uVar10;
          if ((0x11 < uVar12) || (plVar8 == plVar6)) break;
          uVar12 = uVar4;
        } while (uVar10 < max_digits);
      }
      bigint::mul(result,(&powers_of_ten_uint64)[uVar4]);
      if (uVar10 == max_digits) {
        if (uVar13 == 0) goto LAB_003dc3ba;
        uVar3 = (result->vec).length;
        uVar4 = 0;
        goto LAB_003dc358;
      }
      if (uVar13 != 0) {
        uVar3 = (result->vec).length;
        uVar4 = 0;
        do {
          if (uVar3 == uVar4) {
            if (uVar3 < 0x3e) {
              (result->vec).data[uVar3] = uVar13;
              (result->vec).length = uVar3 + 1;
            }
            break;
          }
          plVar1 = (result->vec).data + uVar4;
          bVar14 = CARRY8(*plVar1,uVar13);
          *plVar1 = *plVar1 + uVar13;
          uVar4 = uVar4 + 1;
          uVar13 = (ulong)bVar14;
        } while (bVar14);
      }
    } while (plVar8 != plVar6);
  }
  plVar6 = (long *)(num->fraction).ptr;
  if (plVar6 == (long *)0x0) {
    return;
  }
  sVar2 = (num->fraction).length;
  plVar9 = (long *)((long)plVar6 + sVar2);
  plVar8 = plVar6;
  sVar11 = sVar2;
  if (*digits == 0) {
    for (; (7 < (long)sVar11 && (*plVar8 == 0x3030303030303030)); plVar8 = plVar8 + 1) {
      sVar11 = sVar11 - 8;
    }
    for (; (plVar8 != plVar9 && ((char)*plVar8 == '0')); plVar8 = (long *)((long)plVar8 + 1)) {
    }
  }
  if (plVar8 == plVar9) {
    return;
  }
  do {
    if ((long)plVar9 - (long)plVar8 < 8) {
      uVar4 = 0;
      uVar13 = 0;
    }
    else {
      sVar11 = *digits;
      pcVar7 = (char *)((long)plVar6 + ((sVar2 - 8) - (long)plVar8));
      uVar10 = max_digits - sVar11;
      uVar13 = 0;
      uVar4 = 0;
      do {
        if (uVar10 < 8) {
          plVar8 = (long *)((long)plVar8 + uVar4);
          goto LAB_003dc27b;
        }
        uVar12 = *(long *)((long)plVar8 + uVar4) + 0xcfcfcfcfcfcfcfd0;
        uVar12 = (uVar12 >> 8) + uVar12 * 10;
        uVar13 = ((uVar12 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar12 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar13 * 100000000;
        uVar12 = uVar4 + 8;
        *digits = sVar11 + 8 + uVar4;
        if ((long)pcVar7 < 8) break;
        pcVar7 = pcVar7 + -8;
        uVar10 = uVar10 - 8;
        bVar14 = uVar4 == 0;
        uVar4 = uVar12;
      } while (bVar14);
      plVar8 = (long *)((long)plVar8 + uVar12);
      uVar4 = uVar12;
    }
LAB_003dc27b:
    uVar10 = *digits;
    uVar12 = uVar4;
    if ((plVar8 != plVar9 && uVar4 < 0x13) && uVar10 < max_digits) {
      do {
        uVar13 = ((long)(char)*plVar8 + uVar13 * 10) - 0x30;
        plVar8 = (long *)((long)plVar8 + 1);
        uVar4 = uVar12 + 1;
        uVar10 = uVar10 + 1;
        *digits = uVar10;
        if ((0x11 < uVar12) || (plVar8 == plVar9)) break;
        uVar12 = uVar4;
      } while (uVar10 < max_digits);
    }
    bigint::mul(result,(&powers_of_ten_uint64)[uVar4]);
    if (uVar10 == max_digits) {
      if (uVar13 == 0) goto LAB_003dc4d7;
      uVar3 = (result->vec).length;
      uVar4 = 0;
      goto LAB_003dc387;
    }
    if (uVar13 != 0) {
      uVar3 = (result->vec).length;
      uVar4 = 0;
      do {
        if (uVar3 == uVar4) {
          if (uVar3 < 0x3e) {
            (result->vec).data[uVar3] = uVar13;
            (result->vec).length = uVar3 + 1;
          }
          break;
        }
        plVar1 = (result->vec).data + uVar4;
        bVar14 = CARRY8(*plVar1,uVar13);
        *plVar1 = *plVar1 + uVar13;
        uVar4 = uVar4 + 1;
        uVar13 = (ulong)bVar14;
      } while (bVar14);
    }
    if (plVar8 == plVar9) {
      return;
    }
  } while( true );
  while( true ) {
    plVar1 = (result->vec).data + uVar4;
    bVar14 = CARRY8(*plVar1,uVar13);
    *plVar1 = *plVar1 + uVar13;
    uVar4 = uVar4 + 1;
    uVar13 = (ulong)bVar14;
    if (!bVar14) break;
LAB_003dc358:
    if (uVar3 == uVar4) {
      if (uVar3 < 0x3e) {
        (result->vec).data[uVar3] = uVar13;
        (result->vec).length = uVar3 + 1;
      }
      break;
    }
  }
LAB_003dc3ba:
  for (lVar5 = (long)plVar6 - (long)plVar8; 7 < lVar5; lVar5 = lVar5 + -8) {
    if (*plVar8 != 0x3030303030303030) {
      bVar14 = true;
      goto LAB_003dc415;
    }
    plVar8 = plVar8 + 1;
  }
  if (plVar8 == plVar6) {
    bVar14 = false;
  }
  else {
    do {
      plVar9 = (long *)((long)plVar8 + 1);
      bVar14 = (char)*plVar8 != '0';
      if (bVar14) break;
      plVar8 = plVar9;
    } while (plVar9 != plVar6);
  }
LAB_003dc415:
  plVar6 = (long *)(num->fraction).ptr;
  if (plVar6 != (long *)0x0) {
    sVar2 = (num->fraction).length;
    plVar9 = plVar6;
    for (sVar11 = sVar2; 7 < (long)sVar11; sVar11 = sVar11 - 8) {
      if (*plVar9 != 0x3030303030303030) {
        bVar15 = true;
        goto LAB_003dc478;
      }
      plVar9 = plVar9 + 1;
    }
    plVar6 = (long *)((long)plVar6 + sVar2);
    if (plVar9 == plVar6) {
      bVar15 = false;
    }
    else {
      do {
        plVar8 = (long *)((long)plVar9 + 1);
        bVar15 = (char)*plVar9 != '0';
        if (bVar15) break;
        plVar9 = plVar8;
      } while (plVar8 != plVar6);
    }
LAB_003dc478:
    bVar14 = (bool)(bVar14 | bVar15);
  }
  if (!bVar14) {
    return;
  }
  bigint::mul(result,10);
  uVar3 = (result->vec).length;
  uVar13 = (ulong)uVar3;
  uVar10 = 1;
  uVar4 = 0;
  do {
    if (uVar13 == uVar4) goto LAB_003dc54e;
    plVar1 = (result->vec).data + uVar4;
    bVar14 = CARRY8(*plVar1,uVar10);
    *plVar1 = *plVar1 + uVar10;
    uVar4 = uVar4 + 1;
    uVar10 = (ulong)bVar14;
  } while (bVar14);
  goto LAB_003dc562;
LAB_003dc54e:
  if (uVar3 < 0x3e) {
    (result->vec).data[uVar13] = uVar10;
    (result->vec).length = uVar3 + 1;
  }
  goto LAB_003dc562;
  while( true ) {
    plVar1 = (result->vec).data + uVar4;
    bVar14 = CARRY8(*plVar1,uVar13);
    *plVar1 = *plVar1 + uVar13;
    uVar4 = uVar4 + 1;
    uVar13 = (ulong)bVar14;
    if (!bVar14) break;
LAB_003dc387:
    if (uVar3 == uVar4) {
      if (uVar3 < 0x3e) {
        (result->vec).data[uVar3] = uVar13;
        (result->vec).length = uVar3 + 1;
      }
      break;
    }
  }
LAB_003dc4d7:
  for (lVar5 = (long)plVar9 - (long)plVar8; 7 < lVar5; lVar5 = lVar5 + -8) {
    if (*plVar8 != 0x3030303030303030) goto LAB_003dc514;
    plVar8 = plVar8 + 1;
  }
  while( true ) {
    if (plVar8 == plVar9) {
      return;
    }
    if ((char)*plVar8 != '0') break;
    plVar8 = (long *)((long)plVar8 + 1);
  }
LAB_003dc514:
  bigint::mul(result,10);
  uVar3 = (result->vec).length;
  uVar13 = (ulong)uVar3;
  uVar10 = 1;
  uVar4 = 0;
  do {
    if (uVar13 == uVar4) goto LAB_003dc54e;
    plVar1 = (result->vec).data + uVar4;
    bVar14 = CARRY8(*plVar1,uVar10);
    *plVar1 = *plVar1 + uVar10;
    uVar4 = uVar4 + 1;
    uVar10 = (ulong)bVar14;
  } while (bVar14);
LAB_003dc562:
  *digits = *digits + 1;
  return;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
void parse_mantissa(bigint& result, parsed_number_string_t<UC>& num, size_t max_digits, size_t& digits) noexcept {
  // try to minimize the number of big integer and scalar multiplication.
  // therefore, try to parse 8 digits at a time, and multiply by the largest
  // scalar value (9 or 19 digits) for each step.
  size_t counter = 0;
  digits = 0;
  limb value = 0;
#ifdef FASTFLOAT_64BIT_LIMB
  size_t step = 19;
#else
  size_t step = 9;
#endif

  // process all integer digits.
  UC const * p = num.integer.ptr;
  UC const * pend = p + num.integer.len();
  skip_zeros(p, pend);
  // process all digits, in increments of step per loop
  while (p != pend) {
    while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
      parse_eight_digits(p, value, counter, digits);
    }
    while (counter < step && p != pend && digits < max_digits) {
      parse_one_digit(p, value, counter, digits);
    }
    if (digits == max_digits) {
      // add the temporary value, then check if we've truncated any digits
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      bool truncated = is_truncated(p, pend);
      if (num.fraction.ptr != nullptr) {
        truncated |= is_truncated(num.fraction);
      }
      if (truncated) {
        round_up_bigint(result, digits);
      }
      return;
    } else {
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      counter = 0;
      value = 0;
    }
  }

  // add our fraction digits, if they're available.
  if (num.fraction.ptr != nullptr) {
    p = num.fraction.ptr;
    pend = p + num.fraction.len();
    if (digits == 0) {
      skip_zeros(p, pend);
    }
    // process all digits, in increments of step per loop
    while (p != pend) {
      while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
        parse_eight_digits(p, value, counter, digits);
      }
      while (counter < step && p != pend && digits < max_digits) {
        parse_one_digit(p, value, counter, digits);
      }
      if (digits == max_digits) {
        // add the temporary value, then check if we've truncated any digits
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        bool truncated = is_truncated(p, pend);
        if (truncated) {
          round_up_bigint(result, digits);
        }
        return;
      } else {
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        counter = 0;
        value = 0;
      }
    }
  }

  if (counter != 0) {
    add_native(result, limb(powers_of_ten_uint64[counter]), value);
  }
}